

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseTemplateArg(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  bool bVar11;
  State copy;
  
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  uVar6 = state->prev_name_length;
  uVar7 = state->nest_level;
  uVar8 = state->append;
  uVar9 = state->overflowed;
  if ((byte)(*state->mangled_cur + 0xb7U) < 2) {
    state->mangled_cur = state->mangled_cur + 1;
    do {
      bVar10 = ParseTemplateArg(state);
    } while (bVar10);
    if (*state->mangled_cur == 'E') {
      state->mangled_cur = state->mangled_cur + 1;
      return true;
    }
  }
  state->prev_name = pcVar5;
  state->prev_name_length = uVar6;
  state->nest_level = uVar7;
  state->append = (bool)uVar8;
  state->overflowed = (bool)uVar9;
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  state->mangled_cur = pcVar1;
  state->out_cur = pcVar2;
  bVar10 = ParseType(state);
  bVar11 = true;
  if ((!bVar10) && (bVar10 = ParseExprPrimary(state), !bVar10)) {
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    if (*state->mangled_cur == 'X') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar10 = ParseExpression(state);
      if ((bVar10) && (*state->mangled_cur == 'E')) {
        state->mangled_cur = state->mangled_cur + 1;
        return true;
      }
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool ParseTemplateArg(State *state) {
  State copy = *state;
  if ((ParseOneCharToken(state, 'I') || ParseOneCharToken(state, 'J')) &&
      ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseType(state) ||
      ParseExprPrimary(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;
  return false;
}